

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O2

int kvtree_print_mode(kvtree *hash,int indent,int mode)

{
  kvtree_elem_struct *pkVar1;
  char *pcVar2;
  kvtree *pkVar3;
  kvtree_elem_struct *pkVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  kvtree_struct *hash_00;
  uint indent_00;
  undefined1 local_838 [1024];
  char tmp [1024];
  
  uVar6 = 0;
  uVar7 = 0;
  if (0 < indent) {
    uVar7 = (ulong)(uint)indent;
  }
  for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
    tmp[uVar6] = ' ';
  }
  tmp[indent] = '\0';
  if (hash == (kvtree *)0x0) {
    printf("%sNULL LIST\n",tmp);
  }
  else {
    indent_00 = indent + 2;
    uVar6 = 0;
    if (0 < (int)indent_00) {
      uVar6 = (ulong)indent_00;
    }
    while (pkVar1 = ((anon_struct_16_2_6a822a49_for_pointers *)hash)->le_next,
          pkVar1 != (kvtree_elem_struct *)0x0) {
      for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
        local_838[uVar7] = 0x20;
      }
      local_838[(int)indent_00] = 0;
      if (mode == 2) {
        pcVar2 = pkVar1->key;
        if (pcVar2 == (char *)0x0) {
          printf("%sNULL KEY\n",local_838);
          hash_00 = pkVar1->hash;
        }
        else {
          pkVar3 = pkVar1->hash;
          iVar5 = kvtree_size(pkVar3);
          if (iVar5 == 1) {
            pkVar4 = pkVar3->lh_first;
            pkVar3 = pkVar4->hash;
            if ((pkVar3 == (kvtree *)0x0) || (iVar5 = kvtree_size(pkVar3), iVar5 == 0)) {
              printf("%s%s = %s\n",local_838,pcVar2,pkVar4->key);
              goto LAB_0010592d;
            }
          }
          printf("%s%s\n",local_838,pcVar2);
          hash_00 = pkVar1->hash;
        }
        iVar5 = 2;
LAB_00105927:
        kvtree_print_mode(hash_00,indent_00,iVar5);
      }
      else if (mode == 1) {
        if (pkVar1->key == (char *)0x0) {
          printf("%sNULL KEY\n",local_838);
        }
        else {
          printf("%s%s\n",local_838);
        }
        hash_00 = pkVar1->hash;
        iVar5 = 1;
        goto LAB_00105927;
      }
LAB_0010592d:
      hash = (kvtree *)&pkVar1->pointers;
    }
  }
  return 0;
}

Assistant:

int kvtree_print_mode(const kvtree* hash, int indent, int mode)
{
  char tmp[KVTREE_MAX_FILENAME];
  int i;
  for (i = 0; i < indent; i++) {
    tmp[i] = ' ';
  }
  tmp[indent] = '\0';

  if (hash != NULL) {
    kvtree_elem* elem;
    LIST_FOREACH(elem, hash, pointers) {
      kvtree_elem_print(elem, indent + 2, mode);
    }
  } else {
    printf("%sNULL LIST\n", tmp);
  }
  return KVTREE_SUCCESS;
}